

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage2d_max_level
               (NegativeTestContext *ctx)

{
  GLuint aGVar1 [2];
  int iVar2;
  deUint32 target;
  CubeFace local_84;
  GLenum faceGL_1;
  int faceIterTcu_1;
  deUint32 log2MaxCubemapSize;
  int local_58;
  deUint32 log2MaxTextureSize;
  allocator<char> local_41;
  string local_40;
  deUint32 local_20;
  CubeFace local_1c;
  GLenum faceGL;
  int faceIterTcu;
  GLuint textures [2];
  NegativeTestContext *ctx_local;
  
  textures = (GLuint  [2])ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,&faceGL);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0xde1,faceGL);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)textures,0xde1,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0x8513,faceIterTcu);
  for (local_1c = CUBEFACE_NEGATIVE_X; aGVar1 = textures, (int)local_1c < 6;
      local_1c = local_1c + CUBEFACE_POSITIVE_X) {
    local_20 = cubeFaceToGLFace(local_1c);
    glu::CallLogWrapper::glTexImage2D
              ((CallLogWrapper *)textures,local_20,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE) for 2D texture targets."
             ,&local_41);
  NegativeTestContext::beginSection((NegativeTestContext *)aGVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  iVar2 = NegativeTestContext::getInteger((NegativeTestContext *)textures,0xd33);
  local_58 = deLog2Floor32(iVar2);
  local_58 = local_58 + 1;
  glu::CallLogWrapper::glCopyTexSubImage2D((CallLogWrapper *)textures,0xde1,local_58,0,0,0,0,4,4);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  aGVar1 = textures;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log2MaxCubemapSize,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_SIZE) for cubemap targets."
             ,(allocator<char> *)((long)&faceIterTcu_1 + 3));
  NegativeTestContext::beginSection((NegativeTestContext *)aGVar1,(string *)&log2MaxCubemapSize);
  std::__cxx11::string::~string((string *)&log2MaxCubemapSize);
  std::allocator<char>::~allocator((allocator<char> *)((long)&faceIterTcu_1 + 3));
  iVar2 = NegativeTestContext::getInteger((NegativeTestContext *)textures,0x851c);
  iVar2 = deLog2Floor32(iVar2);
  for (local_84 = CUBEFACE_NEGATIVE_X; (int)local_84 < 6; local_84 = local_84 + CUBEFACE_POSITIVE_X)
  {
    target = cubeFaceToGLFace(local_84);
    glu::CallLogWrapper::glCopyTexSubImage2D
              ((CallLogWrapper *)textures,target,iVar2 + 1,0,0,0,0,4,4);
    NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  }
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)textures,2,&faceGL);
  return;
}

Assistant:

void copytexsubimage2d_max_level (NegativeTestContext& ctx)
{
	GLuint textures[2];
	ctx.glGenTextures	(2, &textures[0]);
	ctx.glBindTexture	(GL_TEXTURE_2D, textures[0]);
	ctx.glTexImage2D	(GL_TEXTURE_2D, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture	(GL_TEXTURE_CUBE_MAP, textures[1]);
	FOR_CUBE_FACES(faceGL, ctx.glTexImage2D(faceGL, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0););

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE) for 2D texture targets.");
	deUint32 log2MaxTextureSize = deLog2Floor32(ctx.getInteger(GL_MAX_TEXTURE_SIZE)) + 1;
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, log2MaxTextureSize, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_SIZE) for cubemap targets.");
	deUint32 log2MaxCubemapSize = deLog2Floor32(ctx.getInteger(GL_MAX_CUBE_MAP_TEXTURE_SIZE)) + 1;
	FOR_CUBE_FACES(faceGL,
	{
		ctx.glCopyTexSubImage2D(faceGL, log2MaxCubemapSize, 0, 0, 0, 0, 4, 4);
		ctx.expectError(GL_INVALID_VALUE);
	});
	ctx.endSection();

	ctx.glDeleteTextures(2, &textures[0]);
}